

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

UniValue *
wallet::SendMoney(UniValue *__return_storage_ptr__,CWallet *wallet,CCoinControl *coin_control,
                 vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_> *recipients,
                 mapValue_t map_value,bool verbose)

{
  _Atomic_word *p_Var1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  __normal_iterator<wallet::CRecipient_*,_std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>_>
  __first;
  __normal_iterator<wallet::CRecipient_*,_std::vector<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>_>
  __last;
  _Base_ptr p_Var4;
  string key;
  string key_00;
  UniValue val;
  UniValue val_00;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined1 auVar6 [24];
  bool bVar7;
  T *pTVar8;
  UniValue *pUVar9;
  FeeReason reason;
  undefined7 in_register_00000081;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var10;
  undefined4 in_R9D;
  long in_FS_OFFSET;
  CTransactionRef tx;
  Result<wallet::CreatedTransactionResult> res;
  undefined1 in_stack_fffffffffffffd58 [12];
  pointer ppVar11;
  pointer ppVar12;
  pointer ppVar13;
  element_type *peVar14;
  pointer this;
  pointer in_stack_fffffffffffffda0;
  _Alloc_hider in_stack_fffffffffffffda8;
  pointer in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdc0 [16];
  vector<UniValue,_std::allocator<UniValue>_> local_220;
  size_type *local_208 [2];
  size_type local_1f8 [2];
  UniValue local_1e8;
  long *local_190 [2];
  long local_180 [2];
  undefined1 *local_170;
  undefined8 local_168;
  undefined1 local_160;
  undefined8 local_15f;
  undefined4 local_157;
  undefined2 local_153;
  char local_151;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_150;
  bilingual_str local_120;
  undefined1 local_e0 [160];
  __index_type local_40;
  long local_38;
  
  p_Var10 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)CONCAT71(in_register_00000081,verbose);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  EnsureWalletIsUnlocked(wallet);
  bVar7 = CWallet::IsWalletFlagSet(wallet,0x100000000);
  if (bVar7) {
    pUVar9 = (UniValue *)__cxa_allocate_exception(0x58);
    local_e0._0_8_ = local_e0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_e0,"Error: Private keys are disabled for this wallet","");
    JSONRPCError(pUVar9,-4,(string *)local_e0);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar9,&::UniValue::typeinfo,::UniValue::~UniValue);
    }
    goto LAB_00c8f795;
  }
  __first._M_current =
       (recipients->super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
       _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (recipients->super__Vector_base<wallet::CRecipient,_std::allocator<wallet::CRecipient>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  FastRandomContext::FastRandomContext((FastRandomContext *)local_e0,false);
  std::
  shuffle<__gnu_cxx::__normal_iterator<wallet::CRecipient*,std::vector<wallet::CRecipient,std::allocator<wallet::CRecipient>>>,FastRandomContext>
            (__first,__last,(FastRandomContext *)local_e0);
  ChaCha20::~ChaCha20((ChaCha20 *)(local_e0 + 0x10));
  CreateTransaction((Result<wallet::CreatedTransactionResult> *)local_e0,wallet,recipients,
                    (optional<unsigned_int>)0x0,coin_control,true);
  if (local_40 != '\x01') {
    pUVar9 = (UniValue *)__cxa_allocate_exception(0x58);
    util::ErrorString<wallet::CreatedTransactionResult>
              (&local_120,(Result<wallet::CreatedTransactionResult> *)local_e0);
    JSONRPCError(pUVar9,-6,&local_120.original);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pUVar9,&::UniValue::typeinfo,::UniValue::~UniValue);
    }
    goto LAB_00c8f795;
  }
  pTVar8 = util::Result<wallet::CreatedTransactionResult>::value
                     ((Result<wallet::CreatedTransactionResult> *)local_e0);
  peVar14 = (pTVar8->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this = (pointer)(pTVar8->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  _Var5 = (pTVar8->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>;
  if (this != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)
               ((long)(this->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      *p_Var1 = *p_Var1 + 1;
      UNLOCK();
    }
    else {
      p_Var1 = (_Atomic_word *)
               ((long)(this->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
      *p_Var1 = *p_Var1 + 1;
    }
  }
  local_150._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_150._M_impl.super__Rb_tree_header._M_header;
  local_150._M_impl.super__Rb_tree_header._M_header._M_parent =
       (p_Var10->_M_impl).super__Rb_tree_header._M_header._M_parent;
  if (local_150._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    p_Var10 = &local_150;
    local_150._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_150._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_150._M_impl.super__Rb_tree_header._M_header._M_right =
         local_150._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    p_Var2 = &(p_Var10->_M_impl).super__Rb_tree_header;
    local_150._M_impl.super__Rb_tree_header._M_header._M_color =
         (p_Var10->_M_impl).super__Rb_tree_header._M_header._M_color;
    p_Var4 = (p_Var10->_M_impl).super__Rb_tree_header._M_header._M_left;
    local_150._M_impl.super__Rb_tree_header._M_header._M_right =
         (p_Var10->_M_impl).super__Rb_tree_header._M_header._M_right;
    (local_150._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         local_150._M_impl.super__Rb_tree_header._M_header._M_left;
    local_150._M_impl.super__Rb_tree_header._M_node_count =
         (p_Var10->_M_impl).super__Rb_tree_header._M_node_count;
    (p_Var10->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (p_Var10->_M_impl).super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    (p_Var10->_M_impl).super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    local_150._M_impl.super__Rb_tree_header._M_header._M_left = p_Var4;
  }
  (p_Var10->_M_impl).super__Rb_tree_header._M_node_count = 0;
  ppVar11 = (pointer)0x0;
  ppVar12 = (pointer)0x0;
  ppVar13 = (pointer)0x0;
  auVar6._16_8_ = 0;
  auVar6._0_16_ = (undefined1  [16])_Var5;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_150;
  tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&stack0xfffffffffffffd90;
  pUVar9 = __return_storage_ptr__;
  CWallet::CommitTransaction
            (wallet,tx,
             (mapValue_t)
             ZEXT3248(CONCAT824(coin_control,
                                CONCAT816(__return_storage_ptr__,
                                          CONCAT412(in_R9D,in_stack_fffffffffffffd58)))),
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )(auVar6 << 0x40));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&stack0xfffffffffffffd78);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_150);
  if (this != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
  }
  if ((char)in_R9D == '\0') {
    base_blob<256u>::GetHex_abi_cxx11_
              (&local_120.original,
               &((pTVar8->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->hash);
    ::UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_120.original);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.original._M_dataplus._M_p != &local_120.original.field_2) goto LAB_00c8f46f;
  }
  else {
    local_170 = &local_160;
    __return_storage_ptr__->typ = VOBJ;
    (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2
    ;
    (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
    *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_15f;
    *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_157;
    *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_153;
    (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_151;
    (__return_storage_ptr__->val)._M_string_length = 0;
    local_168 = 0;
    local_160 = 0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->keys).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"txid","");
    base_blob<256u>::GetHex_abi_cxx11_
              (&local_120.original,
               &((pTVar8->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->hash);
    ::UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_1e8,&local_120.original);
    key._M_string_length._4_4_ = in_R9D;
    key._0_12_ = in_stack_fffffffffffffd58;
    key.field_2._M_allocated_capacity = (size_type)pUVar9;
    key.field_2._8_8_ = coin_control;
    val.val._M_dataplus._M_p = (pointer)ppVar12;
    val._0_8_ = ppVar11;
    val.val._M_string_length = (size_type)ppVar13;
    val.val.field_2._M_allocated_capacity = (size_type)peVar14;
    val.val.field_2._8_8_ = this;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffda0;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffda8._M_p;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffdb0;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffdb8;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffdc0._0_8_;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffdc0._8_8_;
    ::UniValue::pushKV(__return_storage_ptr__,key,val);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1e8.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e8.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.val._M_dataplus._M_p != &local_1e8.val.field_2) {
      operator_delete(local_1e8.val._M_dataplus._M_p,local_1e8.val.field_2._M_allocated_capacity + 1
                     );
    }
    paVar3 = &local_120.original.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.original._M_dataplus._M_p != paVar3) {
      operator_delete(local_120.original._M_dataplus._M_p,
                      local_120.original.field_2._M_allocated_capacity + 1);
    }
    if (local_190[0] != local_180) {
      operator_delete(local_190[0],local_180[0] + 1);
    }
    local_208[0] = local_1f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"fee_reason","");
    pTVar8 = util::Result<wallet::CreatedTransactionResult>::value
                       ((Result<wallet::CreatedTransactionResult> *)local_e0);
    common::StringForFeeReason_abi_cxx11_
              (&local_120.original,(common *)(ulong)(pTVar8->fee_calc).reason,reason);
    ::UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((UniValue *)&stack0xfffffffffffffda0,&local_120.original);
    key_00._M_string_length._4_4_ = in_R9D;
    key_00._0_12_ = in_stack_fffffffffffffd58;
    key_00.field_2._M_allocated_capacity = (size_type)pUVar9;
    key_00.field_2._8_8_ = coin_control;
    val_00.val._M_dataplus._M_p = (pointer)ppVar12;
    val_00._0_8_ = ppVar11;
    val_00.val._M_string_length = (size_type)ppVar13;
    val_00.val.field_2._M_allocated_capacity = (size_type)peVar14;
    val_00.val.field_2._8_8_ = this;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffda0;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffda8._M_p;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffdb0;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffdb8;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffdc0._0_8_;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffdc0._8_8_;
    ::UniValue::pushKV(__return_storage_ptr__,key_00,val_00);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_220);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffffdc8);
    if ((pointer)in_stack_fffffffffffffda8._M_p != (pointer)&stack0xfffffffffffffdb8) {
      operator_delete(in_stack_fffffffffffffda8._M_p,(ulong)(in_stack_fffffffffffffdb8 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.original._M_dataplus._M_p != paVar3) {
      operator_delete(local_120.original._M_dataplus._M_p,
                      local_120.original.field_2._M_allocated_capacity + 1);
    }
    local_120.original.field_2._M_allocated_capacity = local_1f8[0];
    local_120.original._M_dataplus._M_p = (pointer)local_208[0];
    if (local_208[0] != local_1f8) {
LAB_00c8f46f:
      operator_delete(local_120.original._M_dataplus._M_p,
                      local_120.original.field_2._M_allocated_capacity + 1);
    }
  }
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult>
  ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::CreatedTransactionResult> *)
                      local_e0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_00c8f795:
  __stack_chk_fail();
}

Assistant:

UniValue SendMoney(CWallet& wallet, const CCoinControl &coin_control, std::vector<CRecipient> &recipients, mapValue_t map_value, bool verbose)
{
    EnsureWalletIsUnlocked(wallet);

    // This function is only used by sendtoaddress and sendmany.
    // This should always try to sign, if we don't have private keys, don't try to do anything here.
    if (wallet.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "Error: Private keys are disabled for this wallet");
    }

    // Shuffle recipient list
    std::shuffle(recipients.begin(), recipients.end(), FastRandomContext());

    // Send
    auto res = CreateTransaction(wallet, recipients, /*change_pos=*/std::nullopt, coin_control, true);
    if (!res) {
        throw JSONRPCError(RPC_WALLET_INSUFFICIENT_FUNDS, util::ErrorString(res).original);
    }
    const CTransactionRef& tx = res->tx;
    wallet.CommitTransaction(tx, std::move(map_value), /*orderForm=*/{});
    if (verbose) {
        UniValue entry(UniValue::VOBJ);
        entry.pushKV("txid", tx->GetHash().GetHex());
        entry.pushKV("fee_reason", StringForFeeReason(res->fee_calc.reason));
        return entry;
    }
    return tx->GetHash().GetHex();
}